

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_TestShell
           *this)

{
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test *this_00;
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x185);
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test::
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherTypeWithCheckingDisabled)
{
    detector->disableAllocationTypeChecking();
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultNewAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    STRCMP_EQUAL("", reporter->message->asCharString());
    detector->enableAllocationTypeChecking();
}